

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O0

int dmrC_test_allocator(void)

{
  char *pcVar1;
  void *entry;
  void *pvVar2;
  void *pvVar3;
  allocation_blob *saved;
  allocator alloc2;
  foo *t5;
  foo *t4;
  foo *t3;
  foo *t2;
  foo *t1;
  allocator alloc;
  
  dmrC_allocator_init((allocator *)&t1,"foo",8,4,0x28);
  entry = dmrC_allocator_allocate((allocator *)&t1,0);
  if (entry == (void *)0x0) {
    alloc.useful_bytes._4_4_ = 1;
  }
  else if ((int)alloc.size_ == 4) {
    if (alloc.freelist_ == (void *)0x1) {
      if (alloc._24_8_ == 0) {
        pvVar2 = dmrC_allocator_allocate((allocator *)&t1,0);
        if (pvVar2 == (void *)((long)entry + 8)) {
          dmrC_allocator_free((allocator *)&t1,entry);
          dmrC_allocator_free((allocator *)&t1,pvVar2);
          pvVar3 = dmrC_allocator_allocate((allocator *)&t1,0);
          if (pvVar3 == pvVar2) {
            pvVar2 = dmrC_allocator_allocate((allocator *)&t1,0);
            if (pvVar2 == entry) {
              alloc2.useful_bytes = (size_t)dmrC_allocator_allocate((allocator *)&t1,0);
              if (alloc.allocations == 0x50) {
                memset(&saved,0,0x40);
                pcVar1 = alloc.name_;
                dmrC_allocator_transfer((allocator *)&t1,(allocator *)&saved);
                if (alloc.name_ == (char *)0x0) {
                  if (alloc2.name_ == pcVar1) {
                    dmrC_allocator_destroy((allocator *)&saved);
                    printf("allocator tests okay\n");
                    alloc.useful_bytes._4_4_ = 0;
                  }
                  else {
                    alloc.useful_bytes._4_4_ = 1;
                  }
                }
                else {
                  alloc.useful_bytes._4_4_ = 1;
                }
              }
              else {
                alloc.useful_bytes._4_4_ = 1;
              }
            }
            else {
              alloc.useful_bytes._4_4_ = 1;
            }
          }
          else {
            alloc.useful_bytes._4_4_ = 1;
          }
        }
        else {
          alloc.useful_bytes._4_4_ = 1;
        }
      }
      else {
        alloc.useful_bytes._4_4_ = 1;
      }
    }
    else {
      alloc.useful_bytes._4_4_ = 1;
    }
  }
  else {
    alloc.useful_bytes._4_4_ = 1;
  }
  return alloc.useful_bytes._4_4_;
}

Assistant:

int dmrC_test_allocator() {
  struct allocator alloc;
  dmrC_allocator_init(&alloc, "foo", sizeof(struct foo), __alignof__(struct foo),
                 sizeof(struct allocation_blob) + sizeof(struct foo) * 2);
  struct foo *t1 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t1 == NULL)
    return 1;
  if (alloc.alignment_ != __alignof__(struct foo))
    return 1;
  if (alloc.allocations != 1)
    return 1;
  if (alloc.freelist_ != NULL)
    return 1;
  struct foo *t2 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t2 != t1 + 1)
    return 1;
  //dmrC_allocator_show_allocations(&alloc);
  dmrC_allocator_free(&alloc, t1);
  dmrC_allocator_free(&alloc, t2);
  struct foo *t3 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t3 != t2)
    return 1;
  struct foo *t4 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t4 != t1)
    return 1;
  struct foo *t5 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  (void)t5;
  if (alloc.total_bytes !=
      (sizeof(struct allocation_blob) + sizeof(struct foo) * 2) * 2)
    return 1;
  struct allocator alloc2;
  memset(&alloc2, 0, sizeof alloc2);
  struct allocation_blob *saved = alloc.blobs_;
  dmrC_allocator_transfer(&alloc, &alloc2);
  if (alloc.blobs_ != NULL)
	  return 1;
  if (alloc2.blobs_ != saved)
	  return 1;
  dmrC_allocator_destroy(&alloc2);
  printf("allocator tests okay\n");
  return 0;
}